

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O2

bool __thiscall Datetime::initializeEaster(Datetime *this,Pig *pig)

{
  bool bVar1;
  uint uVar2;
  size_type previous;
  tm *t;
  time_t tVar3;
  Datetime *pDVar4;
  long lVar5;
  ulong uVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<int> __l_00;
  allocator_type local_104;
  allocator local_103;
  allocator local_102;
  allocator local_101;
  time_t now;
  vector<int,_std::allocator<int>_> offsets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  holidays;
  string token;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  previous = Pig::cursor(pig);
  std::__cxx11::string::string((string *)&token,"eastermonday",(allocator *)&offsets);
  std::__cxx11::string::string(local_a8,"easter",(allocator *)&now);
  std::__cxx11::string::string(local_88,"ascension",&local_101);
  std::__cxx11::string::string(local_68,"pentecost",&local_102);
  std::__cxx11::string::string(local_48,"goodfriday",&local_103);
  __l._M_len = 5;
  __l._M_array = &token;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&holidays,__l,&local_104);
  lVar5 = 0x80;
  do {
    std::__cxx11::string::~string(local_a8 + lVar5 + -0x20);
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  token._M_dataplus._M_p = (pointer)0x1;
  token._M_string_length = 0x3100000027;
  token.field_2._M_allocated_capacity._0_4_ = 0xfffffffe;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&token;
  std::vector<int,_std::allocator<int>_>::vector(&offsets,__l_00,(allocator_type *)&now);
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_allocated_capacity._0_4_ = token.field_2._M_allocated_capacity._0_4_ & 0xffffff00
  ;
  lVar5 = 0;
  uVar6 = 0;
  do {
    if (uVar6 == 5) {
      Pig::restoreTo(pig,previous);
LAB_0012e482:
      std::__cxx11::string::~string((string *)&token);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&offsets.super__Vector_base<int,_std::allocator<int>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&holidays);
      return uVar6 < 5;
    }
    bVar1 = Pig::skipLiteral(pig,(string *)
                                 ((long)&((holidays.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar5));
    if (bVar1) {
      uVar2 = Pig::peek(pig);
      bVar1 = unicodeLatinAlpha(uVar2);
      if (!bVar1) {
        uVar2 = Pig::peek(pig);
        bVar1 = unicodeLatinDigit(uVar2);
        if (!bVar1) {
          now = time((time_t *)0x0);
          pDVar4 = (Datetime *)&now;
          t = localtime((time_t *)pDVar4);
          easter(pDVar4,(tm *)t);
          tVar3 = mktime(t);
          this->_date = tVar3;
          if (tVar3 < now) {
            pDVar4 = (Datetime *)&now;
            t = localtime((time_t *)pDVar4);
            t->tm_year = t->tm_year + 1;
            easter(pDVar4,(tm *)t);
          }
          t->tm_mday = t->tm_mday +
                       offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar6];
          tVar3 = mktime(t);
          this->_date = tVar3;
          goto LAB_0012e482;
        }
      }
    }
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x20;
  } while( true );
}

Assistant:

bool Datetime::initializeEaster (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  std::vector <std::string> holidays = {"eastermonday", "easter", "ascension", "pentecost", "goodfriday"};
  std::vector <int>         offsets  = {             1,        0,          39,          49,           -2};

  std::string token;
  for (int holiday = 0; holiday < 5; ++holiday)
  {
   if (pig.skipLiteral (holidays[holiday]) &&
       ! unicodeLatinAlpha (pig.peek ()) &&
       ! unicodeLatinDigit (pig.peek ()))
    {
      time_t now = time (nullptr);
      struct tm* t = localtime (&now);

      easter (t);
      _date = mktime (t);

      // If the result is earlier this year, then recalc for next year.
      if (_date < now)
      {
        t = localtime (&now);
        t->tm_year++;
        easter (t);
      }

      // Adjust according to holiday-specific offsets.
      t->tm_mday += offsets[holiday];

      _date = mktime (t);
      return true;
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}